

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

Literal * fromBinaryenLiteral(BinaryenLiteral x)

{
  byte bVar1;
  char *__s;
  bool bVar2;
  IString *this;
  byte *pbVar3;
  undefined1 in_CL;
  Literal *unaff_RBX;
  undefined1 *puVar4;
  undefined8 *puVar5;
  undefined1 *unaff_RBP;
  undefined8 in_RSI;
  Literal *in_RDI;
  Literal *this_00;
  undefined8 *unaff_R14;
  HeapType unaff_R15;
  string_view sVar6;
  HeapType heapType;
  Type type;
  
code_r0x005b098c:
  puVar4 = (undefined1 *)((long)register0x00000020 + -8);
  *(undefined1 **)((long)register0x00000020 + -8) = unaff_RBP;
  *(uintptr_t *)((long)register0x00000020 + -0x10) = unaff_R15.id;
  *(undefined8 **)((long)register0x00000020 + -0x18) = unaff_R14;
  *(Literal **)((long)register0x00000020 + -0x20) = unaff_RBX;
  unaff_R14 = (undefined8 *)((long)register0x00000020 + 8);
  *(undefined8 *)((long)register0x00000020 + -0x28) = *unaff_R14;
  switch(*unaff_R14) {
  case 0:
  case 1:
    goto switchD_005b09bd_caseD_0;
  case 2:
    (in_RDI->field_0).i32 = *(int32_t *)((long)register0x00000020 + 0x10);
    (in_RDI->type).id = 2;
    break;
  case 3:
    (in_RDI->field_0).i64 = *(int64_t *)((long)register0x00000020 + 0x10);
    (in_RDI->type).id = 3;
    break;
  case 4:
    (((Literal *)((long)register0x00000020 + -0x40))->field_0).i32 =
         *(int32_t *)((long)register0x00000020 + 0x10);
    *(undefined8 *)((long)register0x00000020 + -0x30) = 2;
    *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0aba;
    wasm::Literal::castToF32(in_RDI,(Literal *)((long)register0x00000020 + -0x40));
    goto LAB_005b0aba;
  case 5:
    (((Literal *)((long)register0x00000020 + -0x40))->field_0).i64 =
         *(int64_t *)((long)register0x00000020 + 0x10);
    *(undefined8 *)((long)register0x00000020 + -0x30) = 3;
    *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0a8d;
    wasm::Literal::castToF64(in_RDI,(Literal *)((long)register0x00000020 + -0x40));
LAB_005b0aba:
    *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0ac3;
    wasm::Literal::~Literal((Literal *)((long)register0x00000020 + -0x40));
    break;
  case 6:
    *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0a70;
    wasm::Literal::Literal(in_RDI,(uint8_t *)((long)register0x00000020 + 0x10));
    break;
  default:
    *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b09db;
    bVar2 = wasm::Type::isRef((Type *)((long)register0x00000020 + -0x28));
    if (!bVar2) {
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0b1b;
      __assert_fail("type.isRef()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                    ,0x82,"Literal fromBinaryenLiteral(BinaryenLiteral)");
    }
    this_00 = (Literal *)((long)register0x00000020 + -0x28);
    *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b09ec;
    unaff_R15 = wasm::Type::getHeapType((Type *)this_00);
    *(uintptr_t *)((long)register0x00000020 + -0x40) = unaff_R15.id;
    if (0xd < unaff_R15.id) {
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0a2f;
      bVar2 = wasm::HeapType::isSignature((HeapType *)((long)register0x00000020 + -0x40));
      if (bVar2) {
        __s = *(char **)((long)register0x00000020 + 0x10);
        *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0a43;
        this = (IString *)strlen(__s);
        *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0a50;
        sVar6._M_str = (char *)0x0;
        sVar6._M_len = (size_t)__s;
        sVar6 = wasm::IString::interned(this,sVar6,(bool)in_CL);
        *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0a5f;
        wasm::Literal::Literal
                  (in_RDI,(Name)sVar6,(HeapType)*(uintptr_t *)((long)register0x00000020 + -0x40));
        return in_RDI;
      }
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0b3c;
      bVar2 = wasm::HeapType::isData((HeapType *)((long)register0x00000020 + -0x40));
      if (!bVar2) {
        *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0bc6;
        __assert_fail("heapType.isData()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                      ,0x9f,"Literal fromBinaryenLiteral(BinaryenLiteral)");
      }
code_r0x005b0b40:
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0b58;
      wasm::handle_unreachable
                ("TODO: gc data",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                 ,0xa0);
    }
    if ((int)unaff_R15.id - 0xbU < 3) {
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0a0e;
      bVar2 = wasm::Type::isNullable((Type *)((long)register0x00000020 + -0x28));
      if (bVar2) {
        *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0a21;
        wasm::Literal::makeNull(in_RDI,unaff_R15);
        return in_RDI;
      }
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0b77;
      __assert_fail("type.isNullable()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                    ,0x98,"Literal fromBinaryenLiteral(BinaryenLiteral)");
    }
    in_CL = 0xd0;
    pbVar3 = (byte *)((long)&switchD_005b0ae2::switchdataD_00b3b0d0 +
                     (long)(int)(&switchD_005b0ae2::switchdataD_00b3b0d0)[unaff_R15.id & 0xffffffff]
                     );
    switch(unaff_R15.id) {
    case 0:
    case 2:
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0ba7;
      wasm::handle_unreachable
                ("TODO: extern literals",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                 ,0x8a);
    default:
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0afc;
      wasm::handle_unreachable
                ("invalid type",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                 ,0x8f);
    case 4:
      *(undefined1 **)((long)register0x00000020 + -0x50) = &LAB_005b0bde;
      wasm::handle_unreachable
                ("TODO: i31",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                 ,0x87);
    case 7:
    case 8:
    case 9:
    case 10:
      *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0b33;
      wasm::handle_unreachable
                ("TODO: string literals",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                 ,0x94);
    case 0xb:
    case 0xc:
      bVar1 = *pbVar3;
      *pbVar3 = (byte)(CONCAT11(0xffffffffff4c4f2f <
                                (ulong)(long)(int)(&switchD_005b0ae2::switchdataD_00b3b0d0)
                                                  [unaff_R15.id & 0xffffffff],bVar1) >> 7) |
                bVar1 << 2;
      goto code_r0x005b0b40;
    case 0xd:
      puVar5 = (undefined8 *)((long)register0x00000020 + -0x50);
      register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x50);
      *puVar5 = in_RSI;
      unaff_RBX = in_RDI;
      unaff_RBP = puVar4;
      in_RDI = this_00;
    }
    goto code_r0x005b098c;
  }
  return in_RDI;
switchD_005b09bd_caseD_0:
  *(undefined8 *)((long)register0x00000020 + -0x50) = 0x5b0b8f;
  wasm::handle_unreachable
            ("unexpected type",
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
             ,0x7f);
}

Assistant:

Literal fromBinaryenLiteral(BinaryenLiteral x) {
  auto type = Type(x.type);
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(x.i32);
      case Type::i64:
        return Literal(x.i64);
      case Type::f32:
        return Literal(x.i32).castToF32();
      case Type::f64:
        return Literal(x.i64).castToF64();
      case Type::v128:
        return Literal(x.v128);
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(type.isRef());
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic()) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
      case HeapType::any:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::eq:
      case HeapType::func:
      case HeapType::struct_:
      case HeapType::array:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
        assert(type.isNullable());
        return Literal::makeNull(heapType);
    }
  }
  if (heapType.isSignature()) {
    return Literal::makeFunc(Name(x.func), heapType);
  }
  assert(heapType.isData());
  WASM_UNREACHABLE("TODO: gc data");
}